

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_util.c
# Opt level: O3

void print_comm_stat_table(dlog_mt_comm_stat_params_t *comm_stat_table)

{
  ulong uVar1;
  
  printf("\tStart time:     %02d:%02d\n",(ulong)comm_stat_table->perfstats_start_time[0],
         (ulong)comm_stat_table->perfstats_start_time[1]);
  printf("\tDuration:       %02dd\n",(ulong)comm_stat_table->perfstats_duration);
  printf("\tThreshold:      %02d\n",(ulong)comm_stat_table->perfstats_threshold);
  uVar1 = 0;
  do {
    printf("\tTimestamp[%d]:   %02d:%02d\n",uVar1 & 0xffffffff,
           (ulong)comm_stat_table->perfstats_timestamp[uVar1][0],
           (ulong)comm_stat_table->perfstats_timestamp[uVar1][1]);
    uVar1 = uVar1 + 1;
  } while (uVar1 != 4);
  return;
}

Assistant:

extern void print_comm_stat_table(dlog_mt_comm_stat_params_t* comm_stat_table) {
    int i;

    printf("\tStart time:     %02d:%02d\n",
        comm_stat_table->perfstats_start_time[0], comm_stat_table->perfstats_start_time[1]);
    printf("\tDuration:       %02dd\n", comm_stat_table->perfstats_duration);
    printf("\tThreshold:      %02d\n", comm_stat_table->perfstats_threshold);

    for (i = 0; i < 4; i++) {
        printf("\tTimestamp[%d]:   %02d:%02d\n", i,
            comm_stat_table->perfstats_timestamp[i][0], comm_stat_table->perfstats_timestamp[i][1]);
    }
}